

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O3

bilingual_str *
tinyformat::format<long>(bilingual_str *__return_storage_ptr__,bilingual_str *fmt,long *args)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  format<long>(&__return_storage_ptr__->original,&fmt->original,args);
  format<long>(&__return_storage_ptr__->translated,&fmt->translated,args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}